

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpApiRequest.cpp
# Opt level: O2

void __thiscall
xmrig::HttpApiRequest::HttpApiRequest(HttpApiRequest *this,HttpData *req,bool restricted)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  EVP_PKEY_CTX *dst;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  _func_int **pp_Var4;
  EVP_PKEY_CTX *src;
  undefined8 uVar5;
  long lStack_30;
  
  ApiRequest::ApiRequest(&this->super_ApiRequest,SOURCE_HTTP,restricted);
  (this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest =
       (_func_int **)&PTR__HttpApiRequest_001bb938;
  this->m_req = req;
  HttpApiResponse::HttpApiResponse(&this->m_res,req->m_id);
  this->m_parsed = 0;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&this->m_body,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  String::String(&this->m_url,(req->url)._M_dataplus._M_p);
  iVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xb])(this);
  if (iVar2 == 1) {
    iVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[9])(this);
    bVar1 = String::isEqual((String *)CONCAT44(extraout_var,iVar2),"/1/summary");
    if (!bVar1) {
      iVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[9])(this);
      bVar1 = String::isEqual((String *)CONCAT44(extraout_var_00,iVar2),"/2/summary");
      if (!bVar1) {
        iVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[9])(this);
        bVar1 = String::isEqual((String *)CONCAT44(extraout_var_01,iVar2),"/api.json");
        if (!bVar1) goto LAB_0015e573;
      }
    }
    (this->super_ApiRequest).m_type = REQ_SUMMARY;
  }
LAB_0015e573:
  iVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xb])(this);
  if (iVar2 == 3) {
    iVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[9])(this);
    bVar1 = String::isEqual((String *)CONCAT44(extraout_var_02,iVar2),"/json_rpc");
    if (bVar1) {
      (this->super_ApiRequest).m_type = REQ_JSON_RPC;
      (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[2])(this);
      iVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[3])(this);
      pp_Var4 = (this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest;
      uVar5 = 0xffff8044;
      if ((char)iVar2 != '\0') {
LAB_0015e634:
        (*pp_Var4[0x10])(this,uVar5);
        return;
      }
      iVar2 = (*pp_Var4[7])(this,0xffff8044);
      dst = (EVP_PKEY_CTX *)
            Json::getString((Value *)CONCAT44(extraout_var_03,iVar2),"method",(char *)0x0);
      String::copy(&(this->super_ApiRequest).m_rpcMethod,dst,src);
      if ((this->super_ApiRequest).m_rpcMethod.m_size == 0) {
        pp_Var4 = (this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest;
        uVar5 = 0xffff80a8;
        goto LAB_0015e634;
      }
      uVar3 = 0;
      lStack_30 = 0x10;
      goto LAB_0015e626;
    }
  }
  iVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[9])(this);
  if (*(ulong *)(CONCAT44(extraout_var_04,iVar2) + 8) < 5) {
    return;
  }
  iVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[9])(this);
  iVar2 = bcmp(*(void **)CONCAT44(extraout_var_05,iVar2),"/2/",3);
  if (iVar2 != 0) {
    return;
  }
  uVar3 = 2;
  lStack_30 = 8;
LAB_0015e626:
  *(undefined4 *)((long)&(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest + lStack_30) =
       uVar3;
  return;
}

Assistant:

xmrig::HttpApiRequest::HttpApiRequest(const HttpData &req, bool restricted) :
    ApiRequest(SOURCE_HTTP, restricted),
    m_req(req),
    m_res(req.id()),
    m_url(req.url.c_str())
{
    if (method() == METHOD_GET) {
        if (url() == "/1/summary" || url() == "/2/summary" || url() == "/api.json") {
            m_type = REQ_SUMMARY;
        }
    }

    if (method() == METHOD_POST && url() == "/json_rpc") {
        m_type = REQ_JSON_RPC;
        accept();

        if (hasParseError()) {
            done(RPC_PARSE_ERROR);

            return;
        }

        m_rpcMethod = Json::getString(json(), "method");
        if (m_rpcMethod.isEmpty()) {
            done(RPC_INVALID_REQUEST);

            return;
        }

        m_state = STATE_NEW;

        return;
    }

    if (url().size() > 4) {
        if (memcmp(url().data(), "/2/", 3) == 0) {
            m_version = 2;
        }
    }
}